

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_translatev3(matrix4 *self,vector3 *translation)

{
  matrix4 translationMatrix;
  anon_union_64_5_d0a4420b_for_matrix4_0 local_48;
  
  local_48.m[0] = 1.0;
  local_48._4_8_ = 0;
  local_48.m[5] = 1.0;
  local_48._32_8_ = 0;
  local_48.m[10] = 1.0;
  local_48._52_8_ = 0;
  local_48.m[0xf] = 1.0;
  local_48.m[4] = (float)0;
  local_48.m[3] = (translation->field_0).v[0];
  local_48._24_8_ = (ulong)(uint)(translation->field_0).v[1] << 0x20;
  local_48.m[0xc] = (float)0;
  local_48.m[0xb] = (translation->field_0).v[2];
  matrix4_multiply(self,(matrix4 *)&local_48.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_translatev3(struct matrix4 *self, const struct vector3 *translation)
{
	struct matrix4 translationMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_translationv3(&translationMatrix, translation));
}